

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,int num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<3> f)

{
  undefined4 uVar1;
  type tVar2;
  wchar_t wVar3;
  alignment aVar4;
  uint uVar5;
  alignment aVar6;
  size_t sVar7;
  int in_ESI;
  align_spec *in_R8;
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  align_spec *spec_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar8;
  basic_string_view<char> local_10;
  
  sVar7 = basic_string_view<char>::size(&local_10);
  tVar2 = internal::to_unsigned<int>(in_ESI);
  wVar3 = align_spec::fill(in_R8);
  uVar8 = (undefined1)wVar3;
  spec_00 = (align_spec *)0x0;
  aVar4 = align_spec::align(in_R8);
  if (aVar4 == ALIGN_NUMERIC) {
    uVar5 = align_spec::width(in_R8);
    if (sVar7 + tVar2 < (ulong)uVar5) {
      uVar5 = align_spec::width(in_R8);
      spec_00 = (align_spec *)((ulong)uVar5 - (sVar7 + tVar2));
      align_spec::width(in_R8);
    }
  }
  else if (in_ESI < (int)in_R8[1].width_) {
    basic_string_view<char>::size(&local_10);
    internal::to_unsigned<int>(in_R8[1].width_);
    tVar2 = internal::to_unsigned<int>(in_R8[1].width_ - in_ESI);
    spec_00 = (align_spec *)(ulong)tVar2;
    uVar8 = 0x30;
  }
  uVar1 = in_R8->fill_;
  aVar4 = in_R8->align_;
  aVar6 = align_spec::align(in_R8);
  if (aVar6 == ALIGN_DEFAULT) {
    aVar4 = ALIGN_RIGHT;
  }
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)CONCAT17(uVar8,in_stack_ffffffffffffffc0),spec_00,
             (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
              *)CONCAT44(aVar4,uVar1));
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }